

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O2

wchar_t archive_write_mtree_finish_entry(archive_write *a)

{
  long *plVar1;
  long lVar2;
  uint *puVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  
  plVar1 = (long *)a->format_data;
  lVar2 = *plVar1;
  if (lVar2 != 0) {
    *plVar1 = 0;
    puVar3 = *(uint **)(lVar2 + 0x30);
    if (puVar3 != (uint *)0x0) {
      uVar4 = *(uint *)(plVar1 + 0x1c);
      if ((uVar4 & 1) != 0) {
        uVar6 = *(uint *)((long)plVar1 + 0xe4);
        for (uVar5 = plVar1[0x1d]; uVar5 != 0; uVar5 = uVar5 >> 8) {
          uVar6 = uVar6 << 8 ^ crctab[(uint)uVar5 & 0xff ^ uVar6 >> 0x18];
          *(uint *)((long)plVar1 + 0xe4) = uVar6;
        }
        puVar3[1] = ~uVar6;
      }
      if ((uVar4 >> 8 & 1) != 0) {
        __archive_md5final((archive_md5_ctx *)(plVar1 + 0x1e),puVar3 + 2);
        uVar4 = *(uint *)(plVar1 + 0x1c);
      }
      if ((uVar4 >> 0xd & 1) != 0) {
        __archive_ripemd160final((archive_rmd160_ctx *)(plVar1 + 0x1f),puVar3 + 6);
        uVar4 = *(uint *)(plVar1 + 0x1c);
      }
      if ((uVar4 >> 0xe & 1) != 0) {
        __archive_sha1final((archive_sha1_ctx *)(plVar1 + 0x20),puVar3 + 0xb);
        uVar4 = *(uint *)(plVar1 + 0x1c);
      }
      if ((uVar4 >> 0x17 & 1) != 0) {
        __archive_sha256final((archive_sha256_ctx *)(plVar1 + 0x21),puVar3 + 0x10);
        uVar4 = *(uint *)(plVar1 + 0x1c);
      }
      if ((uVar4 >> 0x18 & 1) != 0) {
        __archive_sha384final((archive_sha384_ctx *)(plVar1 + 0x22),puVar3 + 0x18);
        uVar4 = *(uint *)(plVar1 + 0x1c);
      }
      if ((uVar4 >> 0x19 & 1) != 0) {
        __archive_sha512final((archive_sha512_ctx *)(plVar1 + 0x23),puVar3 + 0x24);
        uVar4 = *(uint *)(plVar1 + 0x1c);
      }
      *puVar3 = uVar4;
    }
  }
  return L'\0';
}

Assistant:

static int
archive_write_mtree_finish_entry(struct archive_write *a)
{
	struct mtree_writer *mtree = a->format_data;
	struct mtree_entry *me;

	if ((me = mtree->mtree_entry) == NULL)
		return (ARCHIVE_OK);
	mtree->mtree_entry = NULL;

	if (me->reg_info)
		sum_final(mtree, me->reg_info);

	return (ARCHIVE_OK);
}